

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O3

void cram_stats_dump(cram_stats *st)

{
  kh_m_i2i_t *pkVar1;
  khint_t kVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  
  fwrite("cram_stats:\n",0xc,1,_stderr);
  uVar5 = 0;
  do {
    if (st->freqs[uVar5] != 0) {
      fprintf(_stderr,"\t%d\t%d\n",uVar5 & 0xffffffff);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x400);
  pkVar1 = st->h;
  if ((pkVar1 != (kh_m_i2i_t *)0x0) && (kVar2 = pkVar1->n_buckets, kVar2 != 0)) {
    bVar3 = 0;
    uVar4 = 0;
    do {
      if ((pkVar1->flags[uVar4 >> 4] >> (bVar3 & 0x1e) & 3) == 0) {
        fprintf(_stderr,"\t%d\t%d\n",(ulong)pkVar1->keys[uVar4],(ulong)(uint)pkVar1->vals[uVar4]);
        pkVar1 = st->h;
        kVar2 = pkVar1->n_buckets;
      }
      uVar4 = uVar4 + 1;
      bVar3 = bVar3 + 2;
    } while (uVar4 != kVar2);
  }
  return;
}

Assistant:

void cram_stats_dump(cram_stats *st) {
    int i;
    fprintf(stderr, "cram_stats:\n");
    for (i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	fprintf(stderr, "\t%d\t%d\n", i, st->freqs[i]);
    }
    if (st->h) {
	khint_t k;
	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;

	    fprintf(stderr, "\t%d\t%d\n", kh_key(st->h, k), kh_val(st->h, k));
	}
    }
}